

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall kj::pumpWebSocketLoop(kj *this,WebSocket *from,WebSocket *to)

{
  Coroutine<void> *this_00;
  PromiseAwaiter<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
  *__return_storage_ptr__;
  PromiseAwaiter<void> *__return_storage_ptr___00;
  PromiseAwaiter<void> *__return_storage_ptr___01;
  PromiseAwaiter<void> *__return_storage_ptr___02;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *__return_storage_ptr___03;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_01;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_02;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_03;
  uint uVar1;
  long lVar2;
  SourceLocation location;
  bool bVar3;
  coroutine_handle<void> handle;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_04;
  long lVar4;
  char *pcVar5;
  long lVar6;
  
  handle._M_fr_ptr = operator_new(0xb38);
  *(code **)handle._M_fr_ptr = pumpWebSocketLoop;
  *(code **)((long)handle._M_fr_ptr + 8) = pumpWebSocketLoop;
  this_00 = (Coroutine<void> *)((long)handle._M_fr_ptr + 0x10);
  *(WebSocket **)((long)handle._M_fr_ptr + 0xb28) = to;
  *(WebSocket **)((long)handle._M_fr_ptr + 0xb20) = from;
  location.function = "pumpWebSocketLoop";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0xeb5;
  location.columnNumber = 0x1a;
  _::Coroutine<void>::Coroutine(this_00,handle,location);
  _::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
       ((long)handle._M_fr_ptr + 0x238);
  __return_storage_ptr___00 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x418);
  __return_storage_ptr___01 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x5d0);
  __return_storage_ptr___02 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x788);
  __return_storage_ptr___03 =
       (OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)
       ((long)handle._M_fr_ptr + 0xad8);
  this_01 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0xb00);
  this_02 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0xb08);
  this_03 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0xb10);
  this_04 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0xb18);
  do {
    (**(code **)(**(long **)((long)handle._M_fr_ptr + 0xb20) + 0x30))
              (this_01,*(long **)((long)handle._M_fr_ptr + 0xb20),0x100000);
    co_await<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
              (__return_storage_ptr__,
               (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
               this_01);
    *(undefined1 *)((long)handle._M_fr_ptr + 0xb30) = 0;
    bVar3 = _::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar3) {
      return (PromiseBase)(PromiseBase)this;
    }
    _::PromiseAwaiter<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
    await_resume(__return_storage_ptr___03,__return_storage_ptr__);
    _::PromiseAwaiter<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
    ~PromiseAwaiter(__return_storage_ptr__);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_01);
    uVar1 = __return_storage_ptr___03->tag;
    if (uVar1 == 1) {
      lVar2 = *(long *)((long)handle._M_fr_ptr + 0xae8);
      lVar6 = lVar2;
      if (lVar2 != 0) {
        lVar6 = *(long *)((long)handle._M_fr_ptr + 0xae0);
      }
      lVar4 = lVar2 + -1;
      if (lVar2 == 0) {
        lVar4 = 0;
      }
      (**(code **)(**(long **)((long)handle._M_fr_ptr + 0xb28) + 8))
                (this_02,*(long **)((long)handle._M_fr_ptr + 0xb28),lVar6,lVar4);
      co_await<void>(__return_storage_ptr___00,(Promise<void> *)this_02);
      *(undefined1 *)((long)handle._M_fr_ptr + 0xb30) = 1;
      bVar3 = _::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)__return_storage_ptr___00,(CoroutineBase *)this_00);
      if (bVar3) {
        return (PromiseBase)(PromiseBase)this;
      }
      _::PromiseAwaiter<void>::await_resume(__return_storage_ptr___00);
      _::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___00);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_02);
    }
    else if (uVar1 == 2) {
      (**(code **)**(undefined8 **)((long)handle._M_fr_ptr + 0xb28))
                (this_03,*(undefined8 **)((long)handle._M_fr_ptr + 0xb28),
                 *(undefined8 *)((long)handle._M_fr_ptr + 0xae0),
                 *(undefined8 *)((long)handle._M_fr_ptr + 0xae8));
      co_await<void>(__return_storage_ptr___01,(Promise<void> *)this_03);
      *(undefined1 *)((long)handle._M_fr_ptr + 0xb30) = 2;
      bVar3 = _::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)__return_storage_ptr___01,(CoroutineBase *)this_00);
      if (bVar3) {
        return (PromiseBase)(PromiseBase)this;
      }
      _::PromiseAwaiter<void>::await_resume(__return_storage_ptr___01);
      _::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___01);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_03);
    }
    else if (uVar1 == 3) {
      lVar2 = *(long *)((long)handle._M_fr_ptr + 0xaf0);
      if (lVar2 == 0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)((long)handle._M_fr_ptr + 0xae8);
      }
      (**(code **)(**(long **)((long)handle._M_fr_ptr + 0xb28) + 0x10))
                (this_04,*(long **)((long)handle._M_fr_ptr + 0xb28),
                 *(undefined2 *)((long)handle._M_fr_ptr + 0xae0),pcVar5,lVar2 + (ulong)(lVar2 == 0))
      ;
      co_await<void>(__return_storage_ptr___02,(Promise<void> *)this_04);
      *(undefined1 *)((long)handle._M_fr_ptr + 0xb30) = 3;
      bVar3 = _::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)__return_storage_ptr___02,(CoroutineBase *)this_00);
      if (bVar3) {
        return (PromiseBase)(PromiseBase)this;
      }
      _::PromiseAwaiter<void>::await_resume(__return_storage_ptr___02);
      _::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___02);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_04);
      _::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
                ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
      OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::~OneOf
                (__return_storage_ptr___03);
      *(undefined8 *)handle._M_fr_ptr = 0;
      *(undefined1 *)((long)handle._M_fr_ptr + 0xb30) = 4;
      return (PromiseBase)(PromiseBase)this;
    }
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::~OneOf
              (__return_storage_ptr___03);
  } while( true );
}

Assistant:

static kj::Promise<void> pumpWebSocketLoop(WebSocket& from, WebSocket& to) {
  try {
    while (true) {
      auto message = co_await from.receive();
      KJ_SWITCH_ONEOF(message) {
        KJ_CASE_ONEOF(text, kj::String) {
          co_await to.send(text);
        }
        KJ_CASE_ONEOF(data, kj::Array<byte>) {
          co_await to.send(data);
        }
        KJ_CASE_ONEOF(close, WebSocket::Close) {
          // Once a close has passed through, the pump is complete.
          co_await to.close(close.code, close.reason);
          co_return;
        }
      }
      // continue the loop
    }
  } catch (...) {
    // We don't know if it was a read or a write that threw. If it was a read that threw, we need
    // to send a disconnect on the destination. If it was the destination that threw, it
    // shouldn't hurt to disconnect() it again, but we'll catch and squelch any exceptions.
    kj::runCatchingExceptions([&to]() { to.disconnect(); });

    // In any case, this error broke the pump. We should propagate it out as the pump result.
    throw;
  }
}